

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable*,long_long>
               (BlockVariable *first,longlong n,BlockVariable *d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int *piVar5;
  Data *pDVar6;
  BlockVariable *pBVar7;
  BlockVariable *pBVar8;
  int iVar9;
  BlockVariable **ppBVar10;
  BlockVariable *pBVar11;
  BlockVariable *pBVar12;
  BlockVariable *pBVar13;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  pBVar11 = d_first + n;
  pBVar13 = first;
  pBVar8 = pBVar11;
  if (first < pBVar11) {
    pBVar13 = pBVar11;
    pBVar8 = first;
  }
  pBVar12 = d_first;
  if (pBVar8 != d_first) {
    do {
      pDVar1 = (first->name).d.d;
      (first->name).d.d = (Data *)0x0;
      (pBVar12->name).d.d = pDVar1;
      pcVar2 = (first->name).d.ptr;
      (first->name).d.ptr = (char *)0x0;
      (pBVar12->name).d.ptr = pcVar2;
      qVar3 = (first->name).d.size;
      (first->name).d.size = 0;
      (pBVar12->name).d.size = qVar3;
      iVar9 = first->offset;
      pBVar12->type = first->type;
      pBVar12->offset = iVar9;
      pBVar12->size = first->size;
      pDVar4 = (first->arrayDims).d.d;
      (first->arrayDims).d.d = (Data *)0x0;
      (pBVar12->arrayDims).d.d = pDVar4;
      piVar5 = (first->arrayDims).d.ptr;
      (first->arrayDims).d.ptr = (int *)0x0;
      (pBVar12->arrayDims).d.ptr = piVar5;
      qVar3 = (first->arrayDims).d.size;
      (first->arrayDims).d.size = 0;
      (pBVar12->arrayDims).d.size = qVar3;
      iVar9 = first->matrixStride;
      pBVar12->arrayStride = first->arrayStride;
      pBVar12->matrixStride = iVar9;
      pBVar12->matrixIsRowMajor = first->matrixIsRowMajor;
      pDVar6 = (first->structMembers).d.d;
      (first->structMembers).d.d = (Data *)0x0;
      (pBVar12->structMembers).d.d = pDVar6;
      pBVar7 = (first->structMembers).d.ptr;
      (first->structMembers).d.ptr = (BlockVariable *)0x0;
      (pBVar12->structMembers).d.ptr = pBVar7;
      qVar3 = (first->structMembers).d.size;
      (first->structMembers).d.size = 0;
      (pBVar12->structMembers).d.size = qVar3;
      pBVar12 = pBVar12 + 1;
      first = first + 1;
    } while (pBVar12 != pBVar8);
  }
  local_48.end = d_first;
  local_48.intermediate = pBVar12;
  for (; ppBVar10 = &local_48.end, pBVar12 != pBVar11; pBVar12 = pBVar12 + 1) {
    pDVar1 = (pBVar12->name).d.d;
    (pBVar12->name).d.d = (first->name).d.d;
    (first->name).d.d = pDVar1;
    pcVar2 = (pBVar12->name).d.ptr;
    (pBVar12->name).d.ptr = (first->name).d.ptr;
    (first->name).d.ptr = pcVar2;
    qVar3 = (pBVar12->name).d.size;
    (pBVar12->name).d.size = (first->name).d.size;
    (first->name).d.size = qVar3;
    pBVar12->size = first->size;
    iVar9 = first->offset;
    pBVar12->type = first->type;
    pBVar12->offset = iVar9;
    QArrayDataPointer<int>::operator=(&(pBVar12->arrayDims).d,&(first->arrayDims).d);
    iVar9 = first->matrixStride;
    pBVar12->arrayStride = first->arrayStride;
    pBVar12->matrixStride = iVar9;
    pBVar12->matrixIsRowMajor = first->matrixIsRowMajor;
    QArrayDataPointer<QShaderDescription::BlockVariable>::operator=
              (&(pBVar12->structMembers).d,&(first->structMembers).d);
    first = first + 1;
  }
  while (local_48.iter = ppBVar10, first != pBVar13) {
    QArrayDataPointer<QShaderDescription::BlockVariable>::~QArrayDataPointer
              (&first[-1].structMembers.d);
    pDVar4 = first[-1].arrayDims.d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].arrayDims.d.d)->super_QArrayData,4,0x10);
      }
    }
    first = first + -1;
    pDVar1 = (first->name).d.d;
    ppBVar10 = local_48.iter;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((first->name).d.d)->super_QArrayData,1,0x10);
        ppBVar10 = local_48.iter;
      }
    }
  }
  q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable_*,_long_long>::Destructor::
  ~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}